

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

int ds_list_find_index(DsList *list,void *data)

{
  DS_BOOL DVar1;
  int local_2c;
  DsListEntry *pDStack_28;
  int i;
  DsListEntry *entry;
  void *data_local;
  DsList *list_local;
  
  if (((list != (DsList *)0x0) && (list->equal != (_func_DS_BOOL_void_ptr_void_ptr *)0x0)) &&
     (list->entry != (DsListEntry *)0x0)) {
    pDStack_28 = list->entry;
    local_2c = 0;
    for (; pDStack_28 != (DsListEntry *)0x0; pDStack_28 = pDStack_28->next) {
      DVar1 = (*list->equal)(data,pDStack_28->data);
      if (DVar1 != 0) {
        return local_2c;
      }
      local_2c = local_2c + 1;
    }
  }
  return -1;
}

Assistant:

int ds_list_find_index(DsList *list, void *data)
{
    if (NULL == list || NULL == list->equal || NULL == list->entry)
        return -1;
    DsListEntry *entry = list->entry;
    int i = 0;
    while (entry)
    {
        if ((*(list->equal))(data, entry->data))
            return i;
        i++;
        entry = entry->next;
    }
    return -1;
}